

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int session_ob_data_remove(nghttp2_session *session,nghttp2_stream *stream)

{
  uint uVar1;
  int extraout_EAX;
  
  if ((stream->flags & 0x10) == 0) {
    __assert_fail("stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x3b4,"int session_ob_data_remove(nghttp2_session *, nghttp2_stream *)");
  }
  if (stream->queued == '\x01') {
    uVar1 = stream->extpri & 0x7f;
    if ((byte)uVar1 < 8) {
      nghttp2_pq_remove(&session->sched[uVar1].ob_data,&stream->pq_entry);
      stream->queued = '\0';
      return extraout_EAX;
    }
    __assert_fail("urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x3b9,"int session_ob_data_remove(nghttp2_session *, nghttp2_stream *)");
  }
  __assert_fail("stream->queued == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                ,0x3b5,"int session_ob_data_remove(nghttp2_session *, nghttp2_stream *)");
}

Assistant:

static int session_ob_data_remove(nghttp2_session *session,
                                  nghttp2_stream *stream) {
  uint32_t urgency;

  assert(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES);
  assert(stream->queued == 1);

  urgency = nghttp2_extpri_uint8_urgency(stream->extpri);

  assert(urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS);

  nghttp2_pq_remove(&session->sched[urgency].ob_data, &stream->pq_entry);

  stream->queued = 0;

  return 0;
}